

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
PreventExtensionsInternal
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                              ,0x832,"(IsNotExtensibleSupported)",
                              "This method must not be called for SimpleDictionaryTypeHandler<TPropertyIndex, IsNotExtensibleSupported = false>"
                             );
  if (bVar3) {
    *puVar4 = 0;
    pTVar1 = &(this->super_DynamicTypeHandler).flags;
    *pTVar1 = *pTVar1 & 0xfe;
    bVar3 = DynamicObject::HasObjectArray(instance);
    if (*(long **)&(instance->field_1).field_1 != (long *)0x0 && bVar3) {
      (**(code **)(**(long **)&(instance->field_1).field_1 + 0x1a8))();
    }
    return 1;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::PreventExtensionsInternal(DynamicObject* instance)
    {
        AssertMsg(IsNotExtensibleSupported, "This method must not be called for SimpleDictionaryTypeHandler<TPropertyIndex, IsNotExtensibleSupported = false>");

        this->ClearFlags(IsExtensibleFlag);

        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray)
        {
            objectArray->PreventExtensions();
        }

        return TRUE;
    }